

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_cvars.cpp
# Opt level: O0

void __thiscall FFlagCVar::SetGenericRepDefault(FFlagCVar *this,UCVarValue value,ECVarType type)

{
  uint uVar1;
  undefined4 extraout_var;
  undefined8 local_38;
  UCVarValue def;
  UCVarValue UStack_28;
  ECVarType dummy;
  byte local_1d;
  ECVarType local_1c;
  bool newdef;
  FFlagCVar *pFStack_18;
  ECVarType type_local;
  FFlagCVar *this_local;
  UCVarValue value_local;
  
  UStack_28 = value;
  local_1c = type;
  pFStack_18 = this;
  this_local = (FFlagCVar *)value;
  local_1d = FBaseCVar::ToBool(value,type);
  uVar1 = (*(this->ValueVar->super_FBaseCVar)._vptr_FBaseCVar[7])(this->ValueVar,(long)&def + 4);
  if ((local_1d & 1) == 0) {
    uVar1 = (this->BitVal ^ 0xffffffff) & uVar1;
  }
  else {
    uVar1 = this->BitVal | uVar1;
  }
  local_38 = CONCAT44(extraout_var,uVar1);
  (*(this->ValueVar->super_FBaseCVar)._vptr_FBaseCVar[8])(this->ValueVar,local_38,1);
  return;
}

Assistant:

void FFlagCVar::SetGenericRepDefault (UCVarValue value, ECVarType type)
{
	bool newdef = ToBool (value, type);
	ECVarType dummy;
	UCVarValue def;
	def = ValueVar.GetFavoriteRepDefault (&dummy);
	if (newdef)
		def.Int |= BitVal;
	else
		def.Int &= ~BitVal;
	ValueVar.SetGenericRepDefault (def, CVAR_Int);
}